

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManChoiceConstructiveOne(Aig_Man_t *pNew,Aig_Man_t *pPrev,Aig_Man_t *pThis)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  int iVar12;
  
  if (pNew->nObjs[2] != pPrev->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5ca,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[2] != pThis->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cb,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] != pPrev->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cc,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  if (pNew->nObjs[3] != pThis->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cd,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  pVVar7 = pNew->vObjs;
  if (pVVar7->nSize < 1) {
    bVar4 = false;
  }
  else {
    lVar8 = 0;
    do {
      if (pVVar7->pArray[lVar8] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar8] + 0x18);
        *pbVar1 = *pbVar1 | 0x20;
        pVVar7 = pNew->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
    bVar4 = 0 < pVVar7->nSize;
  }
  pVVar9 = pPrev->vObjs;
  iVar12 = pVVar9->nSize;
  if (0 < (long)iVar12) {
    lVar8 = 0;
    do {
      if ((pVVar9->pArray[lVar8] != (void *)0x0) &&
         ((*(byte *)((*(ulong *)((long)pVVar9->pArray[lVar8] + 0x28) & 0xfffffffffffffffe) + 0x18) &
          0x20) == 0)) {
        __assert_fail("Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5d2,
                      "void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
      }
      lVar8 = lVar8 + 1;
    } while (iVar12 != lVar8);
  }
  if (bVar4) {
    lVar8 = 0;
    do {
      if (pVVar7->pArray[lVar8] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar8] + 0x18);
        *pbVar1 = *pbVar1 & 0xdf;
        pVVar7 = pNew->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
    pVVar9 = pPrev->vObjs;
    iVar12 = pVVar9->nSize;
  }
  if (0 < iVar12) {
    lVar8 = 0;
    do {
      if (pVVar9->pArray[lVar8] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar9->pArray[lVar8] + 0x18);
        *pbVar1 = *pbVar1 | 0x20;
        pVVar9 = pPrev->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar9->nSize);
    if (0 < pVVar9->nSize) {
      lVar8 = 0;
      do {
        if (pVVar9->pArray[lVar8] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar9->pArray[lVar8] + 0x18);
          *pbVar1 = *pbVar1 & 0xdf;
          pVVar9 = pPrev->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar9->nSize);
    }
  }
  pThis->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pVVar7 = pThis->vCis;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      if (pNew->vCis->nSize <= lVar8) goto LAB_0063d246;
      *(void **)((long)pVVar7->pArray[lVar8] + 0x28) = pNew->vCis->pArray[lVar8];
      lVar8 = lVar8 + 1;
      pVVar7 = pThis->vCis;
    } while (lVar8 < pVVar7->nSize);
  }
  pVVar7 = pThis->vCos;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      if (pNew->vCos->nSize <= lVar8) goto LAB_0063d246;
      *(void **)((long)pVVar7->pArray[lVar8] + 0x28) = pNew->vCos->pArray[lVar8];
      lVar8 = lVar8 + 1;
      pVVar7 = pThis->vCos;
    } while (lVar8 < pVVar7->nSize);
  }
  pVVar9 = pThis->vObjs;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar8];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar6 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar11 = Aig_And(pNew,pAVar11,pAVar10);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
        pVVar9 = pThis->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar9->nSize);
    pVVar7 = pThis->vCos;
  }
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      if (pNew->vCos->nSize <= lVar8) {
LAB_0063d246:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (pNew->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5ac,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar11 = (Aig_Obj_t *)(*(ulong *)((long)pNew->vCos->pArray[lVar8] + 8) & 0xfffffffffffffffe);
      iVar12 = pAVar11->Id;
      if (pNew->nReprsAlloc <= iVar12) {
        __assert_fail("pNode1->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5af,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar10 = (Aig_Obj_t *)
                (*(ulong *)((*(ulong *)((long)pVVar7->pArray[lVar8] + 8) & 0xfffffffffffffffe) +
                           0x28) & 0xfffffffffffffffe);
      iVar2 = pAVar10->Id;
      if (pNew->nReprsAlloc <= iVar2) {
        __assert_fail("pNode2->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                      ,0x5b0,"void Aig_ObjSetRepr_(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (pAVar11 != pAVar10) {
        iVar5 = iVar2;
        if (iVar2 < iVar12) {
          iVar5 = iVar12;
        }
        if (iVar12 < iVar2) {
          pAVar10 = pAVar11;
        }
        pNew->pReprs[iVar5] = pAVar10;
        pVVar7 = pThis->vCos;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Aig_ManChoiceConstructiveOne( Aig_Man_t * pNew, Aig_Man_t * pPrev, Aig_Man_t * pThis )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev) );
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis) );
    // make sure the nodes of pPrev point to pNew
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        assert( Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB );
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 0;
    // make sure the nodes of pThis point to pPrev
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 0;
    // remap nodes of pThis on top of pNew using pPrev
    pObj = Aig_ManConst1(pThis);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( pThis, pObj, i )
        pObj->pData = Aig_ManCi(pNew, i);
    Aig_ManForEachCo( pThis, pObj, i )
        pObj->pData = Aig_ManCo(pNew, i);
    // go through the nodes in the topological order
    Aig_ManForEachNode( pThis, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // set the inputs of POs as equivalent
    Aig_ManForEachCo( pThis, pObj, i )
    {
        pObjNew = Aig_ObjFanin0( Aig_ManCo(pNew,i) );
        // pObjNew and Aig_ObjFanin0(pObj)->pData are equivalent
        Aig_ObjSetRepr_( pNew, pObjNew, Aig_Regular((Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData) );
    }
}